

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::ReplaceCharacters(string *s,char *remove,char replacewith)

{
  char *__s;
  undefined1 *puVar1;
  undefined1 in_DL;
  char *in_RSI;
  ulong in_RDI;
  char *str;
  char *str_start;
  char *local_28;
  
  __s = (char *)std::__cxx11::string::c_str();
  for (local_28 = strpbrk(__s,in_RSI); local_28 != (char *)0x0;
      local_28 = strpbrk(local_28 + 1,in_RSI)) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
    *puVar1 = in_DL;
  }
  return;
}

Assistant:

void ReplaceCharacters(string *s, const char *remove, char replacewith) {
  const char *str_start = s->c_str();
  const char *str = str_start;
  for (str = strpbrk(str, remove);
       str != nullptr;
       str = strpbrk(str + 1, remove)) {
    (*s)[str - str_start] = replacewith;
  }
}